

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

void __thiscall QByteArray::reserve(QByteArray *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  QArrayDataPointer<char> *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffffbc;
  QArrayDataPointer<char> *in_stack_ffffffffffffffc0;
  qsizetype local_18;
  QArrayDataPointer<char> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = QArrayDataPointer<char>::needsDetach(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    in_stack_ffffffffffffffc0 = (QArrayDataPointer<char> *)capacity((QByteArray *)0x11bc57);
    qVar2 = QArrayDataPointer<char>::freeSpaceAtBegin(local_10);
    if ((long)local_10 <= (long)in_stack_ffffffffffffffc0 - qVar2) goto LAB_0011bcab;
  }
  local_18 = size(in_RDI);
  plVar3 = qMax<long_long>(&local_18,(longlong *)&local_10);
  ::QByteArray::reallocData((longlong)in_RDI,(AllocationOption)*plVar3);
LAB_0011bcab:
  qVar2 = QArrayDataPointer<char>::constAllocatedCapacity(in_stack_ffffffffffffffc0);
  if (qVar2 != 0) {
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc.i);
    QArrayDataPointer<char>::setFlag
              ((QArrayDataPointer<char> *)0x11bcd8,(ArrayOptions)in_stack_ffffffffffffffbc.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QByteArray::reserve(qsizetype asize)
{
    if (d.needsDetach() || asize > capacity() - d.freeSpaceAtBegin())
        reallocData(qMax(size(), asize), QArrayData::KeepSize);
    if (d.constAllocatedCapacity())
        d.setFlag(Data::CapacityReserved);
}